

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-example.cc
# Opt level: O0

void __thiscall ExprPrinter::ExprPrinter(ExprPrinter *this,int obj_index,int con_index)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  allocator<char> *in_stack_ffffffffffffffd8;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  allocator<char> local_11;
  undefined4 local_10;
  undefined4 local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  mp::
  NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  NullNLHandler(in_RDI);
  (in_RDI->
  super_NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  )._vptr_NLHandler = (_func_int **)&PTR__ExprPrinter_001a14a8;
  *(undefined4 *)
   &in_RDI[1].
    super_NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._vptr_NLHandler = 0;
  std::allocator<char>::allocator();
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::allocator<char>::~allocator(&local_11);
  *(undefined4 *)
   ((long)&in_RDI[0x47].
           super_NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._vptr_NLHandler + 4) = local_c;
  *(undefined4 *)
   &in_RDI[0x48].
    super_NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._vptr_NLHandler = local_10;
  return;
}

Assistant:

ExprPrinter(int obj_index, int con_index)
    : next_expr_id_(0), obj_index_(obj_index), con_index_(con_index) {}